

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incbi.c
# Opt level: O3

double hcephes_incbi(double aa,double bb,double yy0)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double local_108;
  double local_f0;
  double local_e8;
  double local_c8;
  double local_b8;
  undefined1 local_a8 [16];
  double local_98;
  double local_88;
  undefined8 local_78;
  double local_68;
  
  if (yy0 <= 0.0) {
    return 0.0;
  }
  if (1.0 <= yy0) {
    return 1.0;
  }
  local_f0 = yy0;
  local_b8 = bb;
  local_88 = aa;
  if ((aa <= 1.0) || (bb <= 1.0)) {
    local_108 = aa / (aa + bb);
    local_98 = hcephes_incbet(aa,bb,local_108);
    bVar4 = true;
    bVar2 = false;
    local_68 = 1e-06;
    local_e8 = 0.0;
    dVar16 = 1.0;
    local_78 = 0.0;
    local_c8 = 1.0;
    goto LAB_0010565e;
  }
  dVar16 = hcephes_ndtri(yy0);
  if (yy0 <= 0.5) {
    dVar16 = -dVar16;
  }
  else {
    local_f0 = 1.0 - yy0;
    local_88 = bb;
    local_b8 = aa;
  }
  bVar2 = yy0 > 0.5;
  auVar13._0_8_ = dVar16 * dVar16 + -3.0;
  dVar10 = local_88 + local_88 + -1.0;
  auVar14._8_4_ = SUB84(dVar10,0);
  auVar14._0_8_ = local_b8 + local_b8 + -1.0;
  auVar14._12_4_ = (int)((ulong)dVar10 >> 0x20);
  auVar18 = divpd(_DAT_00109490,auVar14);
  dVar10 = auVar18._8_8_ + auVar18._0_8_;
  auVar13._8_8_ = 0x4000000000000000;
  auVar1._8_4_ = SUB84(dVar10,0);
  auVar1._0_8_ = 0x4018000000000000;
  auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
  auVar14 = divpd(auVar13,auVar1);
  dVar15 = auVar14._8_8_;
  dVar10 = dVar15 + auVar14._0_8_;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
    local_a8 = auVar14;
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar16 = (dVar16 * dVar10) / dVar15 -
           (auVar18._0_8_ - auVar18._8_8_) *
           (auVar14._0_8_ + 0.8333333333333334 + -2.0 / (dVar15 * 3.0));
  dVar16 = dVar16 + dVar16;
  if (dVar16 < -745.1332191019412) {
LAB_00105553:
    hcephes_mtherr("incbi",4);
    if (bVar2) {
      return 0.9999999999999999;
    }
    return 0.0;
  }
  dVar16 = exp(dVar16);
  local_108 = local_88 / (dVar16 * local_b8 + local_88);
  local_98 = hcephes_incbet(local_88,local_b8,local_108);
  local_e8 = 0.0;
  if (0.2 <= ABS((local_98 - local_f0) / local_f0)) {
    bVar4 = true;
    local_68 = 0.0001;
    dVar16 = 1.0;
    local_78 = 0.0;
    local_c8 = 1.0;
    goto LAB_0010565e;
  }
  local_c8 = 1.0;
  local_a8._0_8_ = 0x3ff0000000000000;
  local_78 = 0.0;
  local_e8 = 0.0;
LAB_00105a15:
  dVar10 = hcephes_lgam(local_b8 + local_88);
  dVar15 = hcephes_lgam(local_88);
  dVar17 = hcephes_lgam(local_b8);
  iVar5 = 8;
  local_68 = 2.842170943040401e-14;
  bVar4 = false;
  dVar16 = (double)local_a8._0_8_;
  do {
    dVar11 = local_98;
    if (iVar5 != 8) {
      local_a8._0_8_ = dVar16;
      dVar11 = hcephes_incbet(local_88,local_b8,local_108);
    }
    local_98 = local_78;
    dVar12 = local_e8;
    if (local_78 <= dVar11) {
      uVar8 = SUB84(local_c8,0);
      uVar9 = (undefined4)((ulong)local_c8 >> 0x20);
      local_98 = local_c8;
      dVar12 = dVar16;
      if (dVar11 <= local_c8) {
        uVar8 = SUB84(dVar11,0);
        uVar9 = (int)((ulong)dVar11 >> 0x20);
        if (local_f0 <= dVar11) {
          uVar8 = (undefined4)local_78;
          uVar9 = local_78._4_4_;
          dVar16 = local_108;
          local_c8 = dVar11;
        }
        local_e8 = (double)(~-(ulong)(dVar11 < local_f0) & (ulong)local_e8 |
                           -(ulong)(dVar11 < local_f0) & (ulong)local_108);
        local_78 = (double)CONCAT44(uVar9,uVar8);
        local_98 = dVar11;
        dVar12 = local_108;
        goto LAB_00105ba5;
      }
    }
    else {
LAB_00105ba5:
      uVar8 = SUB84(local_c8,0);
      uVar9 = (undefined4)((ulong)local_c8 >> 0x20);
    }
    local_108 = dVar12;
    local_c8 = (double)CONCAT44(uVar9,uVar8);
    if (((local_108 == 1.0) && (!NAN(local_108))) || ((local_108 == 0.0 && (!NAN(local_108)))))
    goto LAB_0010565e;
    local_a8._0_8_ = dVar16;
    dVar11 = log(local_108);
    dVar12 = log(1.0 - local_108);
    dVar11 = dVar11 * (local_88 + -1.0) + dVar12 * (local_b8 + -1.0) + ((dVar10 - dVar15) - dVar17);
    if (dVar11 < -745.1332191019412) {
LAB_00105d94:
      if (!bVar2) {
        return local_108;
      }
      if (local_108 <= 1.1102230246251565e-16) {
        return 0.9999999999999999;
      }
      return 1.0 - local_108;
    }
    if (709.782712893384 < dVar11) {
      bVar4 = false;
      goto LAB_0010565e;
    }
    dVar11 = exp(dVar11);
    dVar11 = (local_98 - local_f0) / dVar11;
    dVar12 = local_108 - dVar11;
    if (dVar12 <= local_e8) {
      local_98 = (local_108 - local_e8) / (dVar16 - local_e8);
      dVar12 = local_98 * 0.5 * (local_108 - local_e8) + local_e8;
      if (0.0 < dVar12) goto LAB_00105cdb;
LAB_00105d83:
      bVar4 = false;
      goto LAB_0010565e;
    }
LAB_00105cdb:
    if (dVar16 <= dVar12) {
      local_98 = (dVar16 - local_108) / (dVar16 - local_e8);
      dVar12 = local_98 * -0.5 * (dVar16 - local_108) + dVar16;
      if (1.0 <= dVar12) goto LAB_00105d83;
    }
    local_108 = dVar12;
    if (ABS(dVar11 / local_108) < 1.4210854715202004e-14) goto LAB_00105d94;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  bVar4 = false;
LAB_0010565e:
  do {
    uVar6 = 0;
    iVar5 = 100;
    dVar10 = 0.5;
LAB_00105697:
    if (iVar5 != 100) {
      dVar17 = dVar16 - local_e8;
      dVar15 = dVar10 * dVar17 + local_e8;
      uVar7 = -(ulong)(dVar15 == 1.0);
      local_108 = (double)(uVar7 & 0x3fefffffffffffff | ~uVar7 & (ulong)dVar15);
      if ((local_108 == 0.0) && (!NAN(local_108))) {
        local_108 = dVar17 * 0.5 + local_e8;
        dVar10 = 0.5;
        if ((local_108 == 0.0) && (!NAN(local_108))) goto LAB_00105553;
      }
      local_a8._0_8_ = dVar16;
      local_98 = hcephes_incbet(local_88,local_b8,local_108);
      if ((local_68 <= ABS(dVar17 / (local_e8 + dVar16))) &&
         (local_68 <= ABS((local_98 - local_f0) / local_f0))) goto LAB_001057d4;
      goto LAB_001059ec;
    }
LAB_001057d4:
    if (local_f0 <= local_98) {
      if ((bVar2) && (local_108 < 1.1102230246251565e-16)) {
        return 0.9999999999999999;
      }
      uVar3 = 0;
      dVar16 = 0.5;
      if ((int)uVar6 < 1) {
        uVar3 = uVar6;
        if ((int)uVar6 < -3) {
          dVar16 = dVar10 * dVar10;
        }
        else if ((int)uVar6 < -1) {
          dVar16 = dVar10 * 0.5;
        }
        else {
          dVar16 = (local_98 - local_f0) / (local_98 - local_78);
        }
      }
      dVar10 = dVar16;
      uVar6 = uVar3 - 1;
      dVar16 = local_108;
      local_c8 = local_98;
LAB_001058c1:
      iVar5 = iVar5 + -1;
      if (iVar5 == 0) {
        local_a8._0_8_ = dVar16;
        hcephes_mtherr("incbi",6);
        if (1.0 <= local_e8) {
          local_108 = 0.9999999999999999;
          goto LAB_00105d94;
        }
        if (local_108 <= 0.0) goto LAB_00105553;
LAB_001059ec:
        if (!bVar4) goto LAB_00105d94;
        goto LAB_00105a15;
      }
      goto LAB_00105697;
    }
    if ((int)uVar6 < 0) {
      uVar6 = 0;
      dVar10 = 0.5;
    }
    else if (uVar6 < 4) {
      if (uVar6 < 2) {
        dVar10 = (local_f0 - local_98) / (local_c8 - local_98);
      }
      else {
        dVar10 = dVar10 * 0.5 + 0.5;
      }
    }
    else {
      dVar10 = 1.0 - (1.0 - dVar10) * (1.0 - dVar10);
    }
    if (local_108 <= 0.75) {
      uVar6 = uVar6 + 1;
      local_e8 = local_108;
      local_78 = local_98;
      goto LAB_001058c1;
    }
    local_f0 = yy0;
    local_b8 = bb;
    local_88 = aa;
    if (!bVar2) {
      local_f0 = 1.0 - yy0;
      local_b8 = aa;
      local_88 = bb;
    }
    bVar2 = !bVar2;
    local_108 = 1.0 - local_108;
    local_98 = hcephes_incbet(local_88,local_b8,local_108);
    local_e8 = 0.0;
    dVar16 = 1.0;
    local_78 = 0.0;
    local_c8 = 1.0;
  } while( true );
}

Assistant:

HCEPHES_API double hcephes_incbi(double aa, double bb, double yy0) {
    double a, b, y0, d, y, x, x0, x1, lgm, yp, di, dithresh, yl, yh, xt;
    int i, rflg, dir, nflg;

    i = 0;
    if (yy0 <= 0)
        return (0.0);
    if (yy0 >= 1.0)
        return (1.0);
    x0 = 0.0;
    yl = 0.0;
    x1 = 1.0;
    yh = 1.0;
    nflg = 0;

    if (aa <= 1.0 || bb <= 1.0) {
        dithresh = 1.0e-6;
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
        x = a / (a + b);
        y = hcephes_incbet(a, b, x);
        goto ihalve;
    } else {
        dithresh = 1.0e-4;
    }
    /* approximation to inverse function */

    yp = -hcephes_ndtri(yy0);

    if (yy0 > 0.5) {
        rflg = 1;
        a = bb;
        b = aa;
        y0 = 1.0 - yy0;
        yp = -yp;
    } else {
        rflg = 0;
        a = aa;
        b = bb;
        y0 = yy0;
    }

    lgm = (yp * yp - 3.0) / 6.0;
    x = 2.0 / (1.0 / (2.0 * a - 1.0) + 1.0 / (2.0 * b - 1.0));
    d = yp * sqrt(x + lgm) / x - (1.0 / (2.0 * b - 1.0) - 1.0 / (2.0 * a - 1.0)) *
                                     (lgm + 5.0 / 6.0 - 2.0 / (3.0 * x));
    d = 2.0 * d;
    if (d < HCEPHES_MINLOG) {
        x = 1.0;
        goto under;
    }
    x = a / (a + b * exp(d));
    y = hcephes_incbet(a, b, x);
    yp = (y - y0) / y0;
    if (fabs(yp) < 0.2)
        goto newt;

/* Resort to interval halving if not close enough. */
ihalve:

    dir = 0;
    di = 0.5;
    for (i = 0; i < 100; i++) {
        if (i != 0) {
            x = x0 + di * (x1 - x0);
            if (x == 1.0)
                x = 1.0 - HCEPHES_MACHEP;
            if (x == 0.0) {
                di = 0.5;
                x = x0 + di * (x1 - x0);
                if (x == 0.0)
                    goto under;
            }
            y = hcephes_incbet(a, b, x);
            yp = (x1 - x0) / (x1 + x0);
            if (fabs(yp) < dithresh)
                goto newt;
            yp = (y - y0) / y0;
            if (fabs(yp) < dithresh)
                goto newt;
        }
        if (y < y0) {
            x0 = x;
            yl = y;
            if (dir < 0) {
                dir = 0;
                di = 0.5;
            } else if (dir > 3)
                di = 1.0 - (1.0 - di) * (1.0 - di);
            else if (dir > 1)
                di = 0.5 * di + 0.5;
            else
                di = (y0 - y) / (yh - yl);
            dir += 1;
            if (x0 > 0.75) {
                if (rflg == 1) {
                    rflg = 0;
                    a = aa;
                    b = bb;
                    y0 = yy0;
                } else {
                    rflg = 1;
                    a = bb;
                    b = aa;
                    y0 = 1.0 - yy0;
                }
                x = 1.0 - x;
                y = hcephes_incbet(a, b, x);
                x0 = 0.0;
                yl = 0.0;
                x1 = 1.0;
                yh = 1.0;
                goto ihalve;
            }
        } else {
            x1 = x;
            if (rflg == 1 && x1 < HCEPHES_MACHEP) {
                x = 0.0;
                goto done;
            }
            yh = y;
            if (dir > 0) {
                dir = 0;
                di = 0.5;
            } else if (dir < -3)
                di = di * di;
            else if (dir < -1)
                di = 0.5 * di;
            else
                di = (y - y0) / (yh - yl);
            dir -= 1;
        }
    }
    hcephes_mtherr("incbi", HCEPHES_PLOSS);
    if (x0 >= 1.0) {
        x = 1.0 - HCEPHES_MACHEP;
        goto done;
    }
    if (x <= 0.0) {
    under:
        hcephes_mtherr("incbi", HCEPHES_UNDERFLOW);
        x = 0.0;
        goto done;
    }

newt:

    if (nflg)
        goto done;
    nflg = 1;
    lgm = hcephes_lgam(a + b) - hcephes_lgam(a) - hcephes_lgam(b);

    for (i = 0; i < 8; i++) {
        /* Compute the function at this point. */
        if (i != 0)
            y = hcephes_incbet(a, b, x);
        if (y < yl) {
            x = x0;
            y = yl;
        } else if (y > yh) {
            x = x1;
            y = yh;
        } else if (y < y0) {
            x0 = x;
            yl = y;
        } else {
            x1 = x;
            yh = y;
        }
        if (x == 1.0 || x == 0.0)
            break;
        /* Compute the derivative of the function at this point. */
        d = (a - 1.0) * log(x) + (b - 1.0) * log(1.0 - x) + lgm;
        if (d < HCEPHES_MINLOG)
            goto done;
        if (d > HCEPHES_MAXLOG)
            break;
        d = exp(d);
        /* Compute the step to the next approximation of x. */
        d = (y - y0) / d;
        xt = x - d;
        if (xt <= x0) {
            y = (x - x0) / (x1 - x0);
            xt = x0 + 0.5 * y * (x - x0);
            if (xt <= 0.0)
                break;
        }
        if (xt >= x1) {
            y = (x1 - x) / (x1 - x0);
            xt = x1 - 0.5 * y * (x1 - x);
            if (xt >= 1.0)
                break;
        }
        x = xt;
        if (fabs(d / x) < 128.0 * HCEPHES_MACHEP)
            goto done;
    }
    /* Did not converge.  */
    dithresh = 256.0 * HCEPHES_MACHEP;
    goto ihalve;

done:

    if (rflg) {
        if (x <= HCEPHES_MACHEP)
            x = 1.0 - HCEPHES_MACHEP;
        else
            x = 1.0 - x;
    }
    return (x);
}